

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rotating_log.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_3399e2::mock_string_stream_traits::mock_string_stream_traits
          (mock_string_stream_traits *this)

{
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)this);
  (this->gmock03_open_44).super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00275e08;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->gmock01_close_45).super_UntypedFunctionMockerBase);
  (this->gmock01_close_45).super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_002760a8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->gmock01_clear_46).super_UntypedFunctionMockerBase);
  (this->gmock01_clear_46).super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_002760a8;
  return;
}

Assistant:

mock_string_stream_traits () {}